

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  if (status == 0) {
    pvVar2 = malloc(0xf8);
    if (pvVar2 == (void *)0x0) {
      pcVar3 = "handle != NULL";
      uStack_20 = 0x2f;
    }
    else {
      iVar1 = uv_tcp_init_ex(server->loop,pvVar2,2);
      if (iVar1 == 0) {
        iVar1 = uv_accept(server,pvVar2);
        if (iVar1 == -0x10) {
          uv_close(server,0);
          uv_close(pvVar2,free);
          return;
        }
        pcVar3 = "r == UV_EBUSY";
        uStack_20 = 0x35;
      }
      else {
        pcVar3 = "r == 0";
        uStack_20 = 0x32;
      }
    }
  }
  else {
    pcVar3 = "status == 0";
    uStack_20 = 0x2c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  struct sockaddr sockname, peername;
  int namelen;
  uv_tcp_t* handle;
  int r;

  if (status != 0) {
    fprintf(stderr, "Connect error %s\n", uv_err_name(status));
  }
  ASSERT(status == 0);

  handle = malloc(sizeof(*handle));
  ASSERT(handle != NULL);

  r = uv_tcp_init(loop, handle);
  ASSERT(r == 0);

  /* associate server with stream */
  handle->data = server;

  r = uv_accept(server, (uv_stream_t*)handle);
  ASSERT(r == 0);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname(handle, &sockname, &namelen);
  ASSERT(r == 0);
  check_sockname(&sockname, "127.0.0.1", server_port, "accepted socket");
  getsocknamecount++;

  namelen = sizeof peername;
  r = uv_tcp_getpeername(handle, &peername, &namelen);
  ASSERT(r == 0);
  check_sockname(&peername, "127.0.0.1", connect_port, "accepted socket peer");
  getpeernamecount++;

  r = uv_read_start((uv_stream_t*)handle, alloc, after_read);
  ASSERT(r == 0);
}